

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

Result __thiscall tonk::Connection::OnControlChannel(Connection *this,uint8_t *data,uint bytes)

{
  bool bVar1;
  void *pvVar2;
  ostream *poVar3;
  ErrorResult *this_00;
  char *source;
  uint in_ECX;
  byte *in_RDX;
  Connection *in_RSI;
  ErrorResult *in_RDI;
  stringstream ss;
  ReadByteStream controlStream;
  P2PConnectParams params;
  uint16_t port_1;
  array<unsigned_char,_16UL> *addrPtr_1;
  array<unsigned_char,_4UL> *addrPtr;
  uint16_t port;
  uint32_t id;
  uint8_t controlType;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  address *in_stack_fffffffffffff658;
  LogStringBuffer *in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff668;
  ErrorType in_stack_fffffffffffff66c;
  address_v6 *in_stack_fffffffffffff670;
  char *in_stack_fffffffffffff678;
  ErrorResult *in_stack_fffffffffffff680;
  LogStringBuffer *in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff6a0;
  uint in_stack_fffffffffffff6a4;
  RefCounter *this_01;
  P2PConnectParams *in_stack_fffffffffffff6d8;
  Channel *pCVar4;
  Connection *in_stack_fffffffffffff6e0;
  undefined1 *puVar5;
  ReadByteStream *in_stack_fffffffffffff718;
  P2PConnectParams *in_stack_fffffffffffff720;
  ErrorResult *pEVar6;
  Connection *this_02;
  string local_8b8 [32];
  stringstream local_898 [16];
  ostream local_888 [399];
  allocator local_6f9;
  string local_6f8 [32];
  undefined1 local_6d8 [94];
  uint16_t local_67a [45];
  byte *local_620;
  byte *local_5d0;
  undefined2 local_5c6;
  uint local_5c4;
  byte local_5bd;
  uint local_5bc;
  byte *local_5b8;
  undefined8 local_590;
  undefined4 local_584;
  string *local_580;
  char *local_578;
  RefCounter *local_570;
  undefined8 local_558;
  undefined4 local_54c;
  string *local_548;
  char *local_540;
  uint *local_530;
  char *local_528;
  Channel *local_520;
  uint16_t *local_518;
  byte *local_510;
  ushort *local_508;
  char *local_500;
  Channel *local_4f8;
  char *local_4f0;
  undefined4 local_4e4;
  Channel *local_4e0;
  undefined4 local_4d4;
  Channel *local_4d0;
  undefined1 local_4b8 [392];
  char *local_330;
  undefined4 local_324;
  Channel *local_320;
  char *local_318;
  string *local_310;
  undefined1 *local_308;
  Channel *local_300;
  string *local_2f8;
  undefined1 *local_2f0;
  Channel *local_2e8;
  string *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  Channel *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  ushort *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  Channel *local_290;
  undefined4 local_284;
  Channel *local_280;
  undefined1 local_268 [392];
  ushort *local_e0;
  char *local_d8;
  undefined4 local_cc;
  Channel *local_c8;
  ushort *local_c0;
  char *local_b8;
  string *local_b0;
  undefined1 *local_a8;
  Channel *local_a0;
  string *local_98;
  undefined1 *local_90;
  Channel *local_88;
  string *local_80;
  undefined1 *local_78;
  ushort *local_70;
  char *local_68;
  undefined1 *local_60;
  Channel *local_58;
  char *local_50;
  undefined1 *local_48;
  Channel *local_40;
  ushort *local_38;
  undefined1 *local_30;
  Channel *local_28;
  ushort *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_5bd = *in_RDX;
  pEVar6 = in_RDI;
  local_5bc = in_ECX;
  local_5b8 = in_RDX;
  if ((local_5bd == 0x80) && (5 < in_ECX)) {
    pCVar4 = &in_RSI->Logger;
    local_528 = "Remote peer set our client id and address via control channel";
    local_4e4 = 1;
    local_4f0 = "Remote peer set our client id and address via control channel";
    local_4d4 = 1;
    this_02 = in_RSI;
    local_520 = pCVar4;
    local_4e0 = pCVar4;
    local_4d0 = pCVar4;
    if ((int)(in_RSI->Logger).ChannelMinLevel < 2) {
      local_324 = 1;
      local_330 = "Remote peer set our client id and address via control channel";
      puVar5 = local_4b8;
      local_320 = pCVar4;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658,Trace);
      local_310 = &(in_RSI->Logger).Prefix;
      local_318 = local_330;
      local_308 = puVar5;
      local_300 = pCVar4;
      local_2f8 = local_310;
      local_2f0 = puVar5;
      local_2e8 = pCVar4;
      local_2e0 = local_310;
      local_2d8 = puVar5;
      std::operator<<((ostream *)(puVar5 + 0x10),(string *)local_310);
      local_2c8 = local_308;
      local_2d0 = local_318;
      local_2b0 = local_308;
      local_2b8 = local_318;
      local_2c0 = pCVar4;
      std::operator<<((ostream *)(local_308 + 0x10),local_318);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                 in_stack_fffffffffffff698);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x13f532);
    }
    local_530 = (uint *)(local_5b8 + 1);
    local_5c4 = *local_530 & 0xffffff;
    local_510 = local_5b8 + 4;
    local_5c6 = *(undefined2 *)local_510;
    local_620 = local_5b8 + 6;
    local_5bc = local_5bc - 6;
    local_5b8 = local_620;
    if (local_5bc == 4) {
      local_5d0 = local_620;
      asio::ip::address_v4::address_v4
                ((address_v4 *)in_stack_fffffffffffff660,(bytes_type *)in_stack_fffffffffffff658);
      asio::ip::address::address
                ((address *)in_stack_fffffffffffff660,(address_v4 *)in_stack_fffffffffffff658);
      asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff660,
                 in_stack_fffffffffffff658,0);
      setSelfAddress(this_02,(uint32_t)((ulong)pEVar6 >> 0x20),(UDPAddress *)in_RDI);
      Result::Success();
      return (Result)pEVar6;
    }
    if (local_5bc == 0x10) {
      asio::ip::address_v6::address_v6
                (in_stack_fffffffffffff670,
                 (bytes_type *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                 (unsigned_long)in_stack_fffffffffffff660);
      asio::ip::address::address
                ((address *)in_stack_fffffffffffff660,(address_v6 *)in_stack_fffffffffffff658);
      asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff660,
                 in_stack_fffffffffffff658,0);
      setSelfAddress(this_02,(uint32_t)((ulong)pEVar6 >> 0x20),(UDPAddress *)in_RDI);
      Result::Success();
      return (Result)pEVar6;
    }
  }
  else {
    if ((local_5bd == 0x85) && (in_ECX == 3)) {
      local_518 = (uint16_t *)(in_RDX + 1);
      local_67a[0] = *local_518;
      in_RSI->RemoteNATMapExternalPort = local_67a[0];
      pCVar4 = &in_RSI->Logger;
      local_500 = "Peer informed its NAT router mapped port ";
      local_508 = local_67a;
      local_294 = 1;
      local_2a0 = "Peer informed its NAT router mapped port ";
      local_284 = 1;
      local_4f8 = pCVar4;
      local_2a8 = local_508;
      local_290 = pCVar4;
      local_280 = pCVar4;
      if ((int)(in_RSI->Logger).ChannelMinLevel < 2) {
        local_cc = 1;
        local_d8 = "Peer informed its NAT router mapped port ";
        puVar5 = local_268;
        local_e0 = local_508;
        local_c8 = pCVar4;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658,Trace);
        local_b0 = &pCVar4->Prefix;
        local_b8 = local_d8;
        local_c0 = local_e0;
        local_a8 = puVar5;
        local_a0 = pCVar4;
        local_98 = local_b0;
        local_90 = puVar5;
        local_88 = pCVar4;
        local_80 = local_b0;
        local_78 = puVar5;
        std::operator<<((ostream *)(puVar5 + 0x10),(string *)local_b0);
        local_60 = local_a8;
        local_68 = local_b8;
        local_70 = local_c0;
        local_48 = local_a8;
        local_50 = local_b8;
        local_8 = local_a8;
        local_10 = local_b8;
        local_58 = pCVar4;
        local_40 = pCVar4;
        std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
        local_30 = local_60;
        local_38 = local_70;
        local_18 = local_60;
        local_20 = local_70;
        local_28 = pCVar4;
        std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write
                  ((OutputWorker *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                   in_stack_fffffffffffff698);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x13fab3);
      }
      Result::Success();
      return (Result)in_RDI;
    }
    if ((local_5bd == 0x90) && (0x15 < in_ECX)) {
      protocol::P2PConnectParams::P2PConnectParams((P2PConnectParams *)0x13faef);
      siamese::ReadByteStream::ReadByteStream
                ((ReadByteStream *)(local_6d8 + 8),local_5b8 + 1,(ulong)(local_5bc - 1));
      bVar1 = protocol::P2PConnectParams::Read(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
      if (bVar1) {
        onP2PStartConnect(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
        Result::Success();
        return (Result)pEVar6;
      }
    }
    else if (((local_5bd == 0xa0) && (((in_ECX == 4 && (in_RDX[1] == 0xa0)) && (in_RDX[2] == 0xa0)))
             ) && (in_RDX[3] == 0xa0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6f8,"Connection closed by peer (gracefully)",&local_6f9);
      this_01 = (RefCounter *)local_6d8;
      local_578 = "Disconnected";
      local_580 = local_6f8;
      local_584 = 0;
      local_590 = 0xc;
      local_570 = this_01;
      pvVar2 = operator_new(0x38);
      ErrorResult::ErrorResult
                (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
                 (ErrorCodeT)in_stack_fffffffffffff660);
      *(void **)this_01 = pvVar2;
      RefCounter::StartShutdown
                (this_01,in_stack_fffffffffffff6a4,(Result *)in_stack_fffffffffffff698);
      Result::~Result((Result *)in_stack_fffffffffffff660);
      std::__cxx11::string::~string(local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      Result::Success();
      return (Result)in_RDI;
    }
  }
  std::__cxx11::stringstream::stringstream(local_898);
  poVar3 = std::operator<<(local_888,"Server sent invalid control channel message ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*local_5b8);
  this_00 = (ErrorResult *)std::operator<<(poVar3," with length ");
  std::ostream::operator<<((ostream *)this_00,local_5bc);
  std::__cxx11::stringstream::str();
  local_540 = "Connection::onControlStreamMessage";
  local_548 = local_8b8;
  local_54c = 0;
  local_558 = 9;
  source = (char *)operator_new(0x38);
  ErrorResult::ErrorResult
            (this_00,source,(string *)in_RDI,in_stack_fffffffffffff66c,
             (ErrorCodeT)in_stack_fffffffffffff660);
  in_RDI->Source = source;
  std::__cxx11::string::~string(local_8b8);
  std::__cxx11::stringstream::~stringstream(local_898);
  return (Result)pEVar6;
}

Assistant:

Result Connection::OnControlChannel(const uint8_t* data, unsigned bytes)
{
    const uint8_t controlType = data[0];

    if (controlType == protocol::ControlChannel_S2C_ClientIdAndAddress &&
        bytes >= 1 + 3 + 2)
    {
        Logger.Debug("Remote peer set our client id and address via control channel");

        TONK_DEBUG_ASSERT(!ClientIdAndAddressIsSet);

        /*
            Note that it is currently safe for this event to be received
            multiple times.  If in the future we add more data then it may
            need a flag to check this being set twice.
        */
        const uint32_t id = siamese::ReadU24_LE_Min4Bytes(data + 1);
        const uint16_t port = siamese::ReadU16_LE(data + 1 + 3);

        data += 1 + 3 + 2;
        bytes -= 1 + 3 + 2;

        if (bytes == 4) // IPv4:
        {
            auto addrPtr = reinterpret_cast<const std::array<uint8_t, 4>*>(data);
            setSelfAddress(id, UDPAddress(asio::ip::address_v4(*addrPtr), port));
            return Result::Success();
        }

        if (bytes == 16) // IPv6:
        {
            auto addrPtr = reinterpret_cast<const std::array<uint8_t, 16>*>(data);
            setSelfAddress(id, UDPAddress(asio::ip::address_v6(*addrPtr), port));
            return Result::Success();
        }
    }
    else if (controlType == protocol::ControlChannel_C2S_NATExternalPort &&
        bytes == protocol::kControlNATExternalBytes)
    {
        const uint16_t port = siamese::ReadU16_LE(data + 1);

        // Peer has announced its NAT-mapped external port
        RemoteNATMapExternalPort = port;

        Logger.Debug("Peer informed its NAT router mapped port ", port);
        return Result::Success();
    }
    else if (controlType == protocol::ControlChannel_S2C_Peer2PeerConnect &&
        bytes >= 1 + protocol::P2PConnectParams::kMinBytes)
    {
        protocol::P2PConnectParams params;
        siamese::ReadByteStream controlStream(data + 1, bytes - 1);
        if (params.Read(controlStream))
        {
            onP2PStartConnect(params);
            return Result::Success();
        }
    }
    else if (controlType == protocol::ControlChannel_Disconnect &&
        bytes == protocol::kControlDisconnectBytes &&
        data[1] == protocol::ControlChannel_Disconnect &&
        data[2] == protocol::ControlChannel_Disconnect &&
        data[3] == protocol::ControlChannel_Disconnect)
    {
        SelfRefCount.StartShutdown(
            Tonk_AppRequest,
            Result("Disconnected",
                "Connection closed by peer (gracefully)",
                ErrorType::Tonk,
                Tonk_AppRequest));
        return Result::Success();
    }

    // Fall through into invalid data handler:

    TONK_DEBUG_BREAK(); // Invalid data

    std::stringstream ss;
    ss << "Server sent invalid control channel message " << (int)data[0] << " with length " << bytes;
    return Result("Connection::onControlStreamMessage", ss.str(), ErrorType::Tonk, Tonk_InvalidData);
}